

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O3

void __thiscall cxxopts::option_exists_error::~option_exists_error(option_exists_error *this)

{
  pointer pcVar1;
  
  *(undefined ***)&(this->super_OptionSpecException).super_OptionException =
       &PTR__OptionException_00158c70;
  pcVar1 = (this->super_OptionSpecException).super_OptionException.m_message._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->super_OptionSpecException).super_OptionException.m_message.field_2) {
    operator_delete(pcVar1);
  }
  std::exception::~exception((exception *)this);
  operator_delete(this);
  return;
}

Assistant:

explicit option_exists_error(const std::string& option)
    : OptionSpecException("Option " + LQUOTE + option + RQUOTE + " already exists")
    {
    }